

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O1

PList * p_ini_file_parameter_list(PIniFile *file,pchar *section,pchar *key)

{
  byte bVar1;
  byte *__s;
  size_t sVar2;
  ushort **ppuVar3;
  pchar *ppVar4;
  PList *list;
  byte *pbVar5;
  long lVar6;
  pchar buf [1025];
  byte local_438 [1032];
  
  __s = (byte *)pp_ini_file_find_parameter(file,section,key);
  if (__s == (byte *)0x0) {
    list = (PList *)0x0;
  }
  else {
    sVar2 = strlen((char *)__s);
    if (((2 < sVar2) && (*__s == 0x7b)) && (__s[sVar2 - 1] == 0x7d)) {
      local_438[0] = 0;
      list = (PList *)0x0;
      pbVar5 = __s;
      do {
        lVar6 = 0;
        while( true ) {
          while( true ) {
            pbVar5 = pbVar5 + 1;
            bVar1 = *pbVar5;
            if ((bVar1 == 0) || (bVar1 == 0x7d)) {
              if (lVar6 != 0) {
                local_438[lVar6] = 0;
                ppVar4 = p_strdup((pchar *)local_438);
                list = p_list_append(list,ppVar4);
              }
              goto LAB_0010887f;
            }
            ppuVar3 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x20) != 0) break;
            local_438[lVar6] = bVar1;
            lVar6 = lVar6 + 1;
          }
          local_438[lVar6] = 0;
          if (lVar6 != 0) break;
          lVar6 = 0;
        }
        ppVar4 = p_strdup((pchar *)local_438);
        list = p_list_append(list,ppVar4);
      } while( true );
    }
    list = (PList *)0x0;
LAB_0010887f:
    p_free(__s);
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_ini_file_parameter_list (const PIniFile	*file,
			   const pchar		*section,
			   const pchar		*key)
{
	PList		*ret = NULL;
	pchar		*val;
	const pchar	*str;
	pchar		buf[P_INI_FILE_MAX_LINE + 1];
	psize		len;
	psize		buf_cnt;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return NULL;

	len = strlen (val);

	if (len < 3 || val[0] != '{' || val[len - 1] != '}') {
		p_free (val);
		return NULL;
	}

	/* Skip first brace '{' symbol */
	str = val + 1;
	buf[0] = '\0';
	buf_cnt = 0;

	while (*str && *str != '}') {
		if (!isspace (* ((const puchar *) str)))
			buf[buf_cnt++] = *str;
		else {
			buf[buf_cnt] = '\0';

			if (buf_cnt > 0)
				ret = p_list_append (ret, p_strdup (buf));

			buf_cnt = 0;
		}

		++str;
	}

	if (buf_cnt > 0) {
		buf[buf_cnt] = '\0';
		ret = p_list_append (ret, p_strdup (buf));
	}

	p_free (val);

	return ret;
}